

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void update_live(MIR_reg_t var,int out_p,bitmap_t live)

{
  ulong nb;
  bitmap_el_t *pbVar1;
  
  nb = (ulong)var;
  if (out_p != 0) {
    bitmap_clear_bit_p(live,nb);
    return;
  }
  bitmap_expand(live,nb + 1);
  pbVar1 = VARR_bitmap_el_taddr(live);
  pbVar1[var >> 6] = pbVar1[var >> 6] | 1L << (nb & 0x3f);
  return;
}

Assistant:

static void update_live (MIR_reg_t var, int out_p, bitmap_t live) {
  if (out_p) {
    bitmap_clear_bit_p (live, var);
  } else {
    bitmap_set_bit_p (live, var);
  }
}